

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::SetExplicitFreeBitOnSmallBlock<SmallAllocationBlockAttributes>
          (Recycler *this,HeapBlock *heapBlock,size_t sizeCat,void *buffer,ObjectInfoBits attributes
          )

{
  HeapBlockType HVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  char *message;
  char *error;
  uint lineNumber;
  
  if (heapBlock->heapBlockType == LargeBlockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x46f,"(!heapBlock->IsLargeHeapBlock())","!heapBlock->IsLargeHeapBlock()");
    if (!bVar3) goto LAB_0072099a;
    *puVar5 = 0;
  }
  iVar4 = (*heapBlock->_vptr_HeapBlock[9])(heapBlock,buffer);
  if (CONCAT44(extraout_var,iVar4) != sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x470,"(heapBlock->GetObjectSize(buffer) == sizeCat)",
                       "heapBlock->GetObjectSize(buffer) == sizeCat");
    if (!bVar3) goto LAB_0072099a;
    *puVar5 = 0;
  }
  HVar1 = heapBlock->heapBlockType;
  if ((attributes & LeafBit) == NoBit) {
    if ((HVar1 < 10) && ((0x252U >> (HVar1 & 0x1f) & 1) != 0)) goto LAB_00720981;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(smallBlock->IsAnyNormalBlock())";
    message = "smallBlock->IsAnyNormalBlock()";
    lineNumber = 0x478;
  }
  else {
    if ((HVar1 == SmallLeafBlockType) || (HVar1 == MediumLeafBlockType)) goto LAB_00720981;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(smallBlock->IsLeafBlock())";
    message = "smallBlock->IsLeafBlock()";
    lineNumber = 0x474;
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                     ,lineNumber,error,message);
  if (!bVar3) {
LAB_0072099a:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00720981:
  SmallHeapBlockT<SmallAllocationBlockAttributes>::SetExplicitFreeBitForObject
            ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)heapBlock,buffer);
  return;
}

Assistant:

void Recycler::SetExplicitFreeBitOnSmallBlock(HeapBlock* heapBlock, size_t sizeCat, void* buffer, ObjectInfoBits attributes)
{
    Assert(!heapBlock->IsLargeHeapBlock());
    Assert(heapBlock->GetObjectSize(buffer) == sizeCat);
    SmallHeapBlockT<TBlockAttributes>* smallBlock = (SmallHeapBlockT<TBlockAttributes>*)heapBlock;
    if ((attributes & ObjectInfoBits::LeafBit) == LeafBit)
    {
        Assert(smallBlock->IsLeafBlock());
    }
    else
    {
        Assert(smallBlock->IsAnyNormalBlock());
    }


#ifdef RECYCLER_MEMORY_VERIFY
    smallBlock->SetExplicitFreeBitForObject(buffer);
#endif
}